

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_verify(secp256k1_fe *a)

{
  undefined4 extraout_EAX;
  int iVar1;
  bool bVar2;
  secp256k1_fe *r;
  ulong uVar3;
  undefined1 auVar4 [16];
  int iStack_44;
  uchar auStack_40 [32];
  secp256k1_fe *psStack_20;
  
  r = a;
  secp256k1_fe_verify_magnitude(a,0x20);
  if ((uint)a->normalized < 2) {
    if (a->normalized != 0) {
      secp256k1_fe_verify_magnitude(a,1);
    }
    r = (secp256k1_fe *)0x1;
    if (a->normalized == 0) {
      r = (secp256k1_fe *)((long)a->magnitude * 2);
    }
    uVar3 = ((long)r << 0x34) - (long)r;
    if (uVar3 < a->n[0]) goto LAB_00124a54;
    if (uVar3 < a->n[1]) goto LAB_00124a59;
    if (uVar3 < a->n[2]) goto LAB_00124a5e;
    if (uVar3 < a->n[3]) goto LAB_00124a63;
    if (a->n[4] <= (ulong)(((long)r << 0x30) - (long)r)) {
      bVar2 = a->n[4] != 0xffffffffffff || a->normalized == 0;
      r = (secp256k1_fe *)CONCAT71(0xffffffffff,bVar2);
      if (((bVar2) || (a->n[0] < 0xffffefffffc2f)) ||
         ((a->n[2] & a->n[1] & a->n[3]) != 0xfffffffffffff)) {
        return;
      }
      goto LAB_00124a6d;
    }
  }
  else {
    secp256k1_fe_verify_cold_7();
LAB_00124a54:
    secp256k1_fe_verify_cold_6();
LAB_00124a59:
    secp256k1_fe_verify_cold_5();
LAB_00124a5e:
    secp256k1_fe_verify_cold_4();
LAB_00124a63:
    secp256k1_fe_verify_cold_3();
  }
  secp256k1_fe_verify_cold_2();
LAB_00124a6d:
  secp256k1_fe_verify_cold_1();
  psStack_20 = a;
  do {
    do {
      iStack_44 = 0;
      testrand256(auStack_40);
      secp256k1_scalar_set_b32((secp256k1_scalar *)r,auStack_40,&iStack_44);
    } while (iStack_44 != 0);
    secp256k1_scalar_verify((secp256k1_scalar *)r);
    auVar4._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
    auVar4._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
    auVar4._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
    auVar4._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
    iVar1 = movmskps(extraout_EAX,auVar4);
  } while (iVar1 == 0xf);
  return;
}

Assistant:

static void secp256k1_fe_verify(const secp256k1_fe *a) {
    /* Magnitude between 0 and 32. */
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 32);
    /* Normalized is 0 or 1. */
    VERIFY_CHECK((a->normalized == 0) || (a->normalized == 1));
    /* If normalized, magnitude must be 0 or 1. */
    if (a->normalized) SECP256K1_FE_VERIFY_MAGNITUDE(a, 1);
    /* Invoke implementation-specific checks. */
    secp256k1_fe_impl_verify(a);
}